

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-misc.cc
# Opt level: O2

void demo_binary(void)

{
  double dVar1;
  ostream *poVar2;
  double y;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> xy_pts_B;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> xy_pts_A;
  Gnuplot gp;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  double local_288 [4];
  double local_268;
  double local_260;
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_258;
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_238;
  string local_220 [32];
  string local_200 [32];
  Gnuplot local_1e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"",(allocator<char> *)local_288);
  gnuplotio::Gnuplot::Gnuplot(&local_1e0,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (local_2a8._M_dataplus._M_p = (pointer)0xc000000000000000;
      (double)local_2a8._M_dataplus._M_p < 2.0;
      local_2a8._M_dataplus._M_p = (pointer)(local_2a8._M_dataplus._M_p + 0.01)) {
    local_288[0] = (double)local_2a8._M_dataplus._M_p * (double)local_2a8._M_dataplus._M_p *
                   (double)local_2a8._M_dataplus._M_p;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double&,double&>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_238,(double *)&local_2a8,local_288);
  }
  local_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar1 = 0.0;
  while (dVar1 < 1.0) {
    local_260 = (dVar1 + dVar1) * 3.14159;
    local_268 = dVar1;
    local_2a8._M_dataplus._M_p = (pointer)cos(local_260);
    local_288[0] = sin(local_260);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_258,(double *)&local_2a8,local_288);
    dVar1 = local_268 + 0.041666666666666664;
  }
  std::operator<<((ostream *)&local_1e0,"set xrange [-2:2]\nset yrange [-2:2]\n");
  poVar2 = std::operator<<((ostream *)&local_1e0,"plot \'-\' binary");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_288,"record",&local_2a9);
  gnuplotio::Gnuplot::
  binfmt<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D>
            (&local_2a8,&local_1e0,&local_238,local_288);
  poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
  poVar2 = std::operator<<(poVar2,"with lines title \'cubic\',");
  poVar2 = std::operator<<(poVar2,"\'-\' binary");
  std::__cxx11::string::string<std::allocator<char>>(local_220,"record",&local_2aa);
  gnuplotio::Gnuplot::
  binfmt<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D>
            (local_200,&local_1e0,&local_258,local_220);
  poVar2 = std::operator<<(poVar2,local_200);
  std::operator<<(poVar2,"with points title \'circle\'\n");
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)local_288);
  gnuplotio::Gnuplot::
  sendBinary<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D>
            (&local_1e0,&local_238);
  gnuplotio::Gnuplot::
  sendBinary<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D>
            (&local_1e0,&local_258);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_258);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_238);
  gnuplotio::Gnuplot::~Gnuplot(&local_1e0);
  return;
}

Assistant:

void demo_binary() {
    Gnuplot gp;

    std::vector<std::pair<double, double>> xy_pts_A;
    for(double x=-2; x<2; x+=0.01) {
        double y = x*x*x;
        xy_pts_A.emplace_back(x, y);
    }

    std::vector<std::pair<double, double>> xy_pts_B;
    for(double alpha=0; alpha<1; alpha+=1.0/24.0) {
        double theta = alpha*2.0*3.14159;
        xy_pts_B.emplace_back(cos(theta), sin(theta));
    }

    gp << "set xrange [-2:2]\nset yrange [-2:2]\n";
    gp << "plot '-' binary" << gp.binFmt1d(xy_pts_A, "record") << "with lines title 'cubic',"
        << "'-' binary" << gp.binFmt1d(xy_pts_B, "record") << "with points title 'circle'\n";
    gp.sendBinary1d(xy_pts_A);
    gp.sendBinary1d(xy_pts_B);

    pause_if_needed();
}